

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_tokenize.c
# Opt level: O3

int error_sprintf(C_Parser *parser,char *fmt,...)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  char in_AL;
  char extraout_AL;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  undefined8 in_RCX;
  undefined8 *puVar8;
  undefined8 in_RDX;
  char *fmt_00;
  ulong uVar9;
  bool bVar10;
  C_Parser *tokenizer;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar11;
  ushort uVar12;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  int iVar21;
  undefined8 in_XMM0_Qa;
  undefined8 extraout_XMM0_Qa;
  undefined8 uVar22;
  undefined8 in_XMM1_Qa;
  undefined8 extraout_XMM1_Qa;
  undefined8 uVar23;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined1 auVar24 [16];
  undefined8 in_XMM5_Qa;
  undefined1 auVar25 [64];
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag _Stack_1e0;
  undefined1 auStack_1c0 [24];
  undefined1 *puStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_180;
  undefined8 uStack_170;
  undefined8 uStack_160;
  undefined8 uStack_150;
  undefined8 uStack_140;
  undefined8 uStack_130;
  undefined8 uStack_120;
  code *pcStack_110;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined1 auVar13 [16];
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (parser->error_message == (char *)0x0) {
    iVar21 = 0;
  }
  else {
    pcStack_110 = (code *)0x122ee7;
    sVar6 = strlen(parser->error_message);
    iVar21 = (int)sVar6;
  }
  uVar11 = 0x80;
  bVar2 = true;
  do {
    bVar10 = bVar2;
    pcStack_110 = (code *)0x122f15;
    pcVar7 = (char *)(*parser->memory_allocator->realloc)
                               (parser->memory_allocator->arena,parser->error_message,
                                (long)(int)(iVar21 + uVar11));
    parser->error_message = pcVar7;
    local_100 = &args[0].overflow_arg_area;
    local_f8 = local_e8;
    pcVar7 = (char *)(ulong)uVar11;
    local_108 = 0x3000000010;
    tokenizer = (C_Parser *)(parser->error_message + iVar21);
    pcStack_110 = (code *)0x122f59;
    puVar8 = &local_108;
    uVar22 = extraout_XMM0_Qa;
    uVar23 = extraout_XMM1_Qa;
    iVar5 = vsnprintf((char *)tokenizer,(size_t)pcVar7,fmt,&local_108);
    if (iVar5 < (int)uVar11) {
      if (-1 < iVar5) {
        return iVar5;
      }
      pcStack_110 = C_error_at;
      error_sprintf_cold_1();
      if (extraout_AL != '\0') {
        uStack_190 = uVar22;
        uStack_180 = uVar23;
        uStack_170 = in_XMM2_Qa;
        uStack_160 = in_XMM3_Qa;
        uStack_150 = in_XMM4_Qa;
        uStack_140 = in_XMM5_Qa;
        uStack_130 = in_XMM6_Qa;
        uStack_120 = in_XMM7_Qa;
      }
      iVar21 = 1;
      pcVar1 = tokenizer->current_file->contents;
      if (pcVar1 < pcVar7) {
        auVar24 = vpmovsxbq_avx(ZEXT216(1));
        auVar25 = ZEXT1664(auVar24);
        auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar24[8] = 10;
        auVar24._0_8_ = 0xa0a0a0a0a0a0a0a;
        auVar24[9] = 10;
        auVar24[10] = 10;
        auVar24[0xb] = 10;
        auVar24[0xc] = 10;
        auVar24[0xd] = 10;
        auVar24[0xe] = 10;
        auVar24[0xf] = 10;
        auVar18 = vpbroadcastq_avx512f();
        uVar9 = 0;
        do {
          auVar19 = vpbroadcastq_avx512f();
          auVar20 = vmovdqa64_avx512f(auVar25);
          auVar25 = vporq_avx512f(auVar19,auVar16);
          auVar19 = vporq_avx512f(auVar19,auVar17);
          uVar22 = vpcmpuq_avx512f(auVar19,auVar18,2);
          bVar3 = (byte)uVar22;
          uVar22 = vpcmpuq_avx512f(auVar25,auVar18,2);
          bVar4 = (byte)uVar22;
          uVar12 = CONCAT11(bVar4,bVar3);
          auVar13 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(pcVar1 + uVar9));
          auVar14[1] = ((byte)(uVar12 >> 1) & 1) * auVar13[1];
          auVar14[0] = (bVar3 & 1) * auVar13[0];
          auVar14[2] = ((byte)(uVar12 >> 2) & 1) * auVar13[2];
          auVar14[3] = ((byte)(uVar12 >> 3) & 1) * auVar13[3];
          auVar14[4] = ((byte)(uVar12 >> 4) & 1) * auVar13[4];
          auVar14[5] = ((byte)(uVar12 >> 5) & 1) * auVar13[5];
          auVar14[6] = ((byte)(uVar12 >> 6) & 1) * auVar13[6];
          auVar14[7] = ((byte)(uVar12 >> 7) & 1) * auVar13[7];
          auVar14[8] = (bVar4 & 1) * auVar13[8];
          auVar14[9] = (bVar4 >> 1 & 1) * auVar13[9];
          auVar14[10] = (bVar4 >> 2 & 1) * auVar13[10];
          auVar14[0xb] = (bVar4 >> 3 & 1) * auVar13[0xb];
          auVar14[0xc] = (bVar4 >> 4 & 1) * auVar13[0xc];
          auVar14[0xd] = (bVar4 >> 5 & 1) * auVar13[0xd];
          auVar14[0xe] = (bVar4 >> 6 & 1) * auVar13[0xe];
          auVar14[0xf] = -((char)bVar4 >> 7) * auVar13[0xf];
          uVar9 = uVar9 + 0x10;
          uVar22 = vpcmpeqb_avx512vl(auVar14,auVar24);
          auVar25 = vpmovm2d_avx512dq(uVar22);
          auVar25 = vpsubd_avx512f(auVar20,auVar25);
        } while (((ulong)(pcVar7 + (0xf - (long)pcVar1)) & 0xfffffffffffffff0) != uVar9);
        auVar16 = vmovdqa32_avx512f(auVar25);
        auVar17._0_4_ = (uint)(bVar3 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar3 & 1) * auVar20._0_4_
        ;
        bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar17._4_4_ = (uint)bVar2 * auVar16._4_4_ | (uint)!bVar2 * auVar20._4_4_;
        bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
        auVar17._8_4_ = (uint)bVar2 * auVar16._8_4_ | (uint)!bVar2 * auVar20._8_4_;
        bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
        auVar17._12_4_ = (uint)bVar2 * auVar16._12_4_ | (uint)!bVar2 * auVar20._12_4_;
        bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
        auVar17._16_4_ = (uint)bVar2 * auVar16._16_4_ | (uint)!bVar2 * auVar20._16_4_;
        bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
        auVar17._20_4_ = (uint)bVar2 * auVar16._20_4_ | (uint)!bVar2 * auVar20._20_4_;
        bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
        auVar17._24_4_ = (uint)bVar2 * auVar16._24_4_ | (uint)!bVar2 * auVar20._24_4_;
        bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
        auVar17._28_4_ = (uint)bVar2 * auVar16._28_4_ | (uint)!bVar2 * auVar20._28_4_;
        auVar17._32_4_ =
             (uint)(bVar4 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar4 & 1) * auVar20._32_4_;
        bVar2 = (bool)(bVar4 >> 1 & 1);
        auVar17._36_4_ = (uint)bVar2 * auVar16._36_4_ | (uint)!bVar2 * auVar20._36_4_;
        bVar2 = (bool)(bVar4 >> 2 & 1);
        auVar17._40_4_ = (uint)bVar2 * auVar16._40_4_ | (uint)!bVar2 * auVar20._40_4_;
        bVar2 = (bool)(bVar4 >> 3 & 1);
        auVar17._44_4_ = (uint)bVar2 * auVar16._44_4_ | (uint)!bVar2 * auVar20._44_4_;
        bVar2 = (bool)(bVar4 >> 4 & 1);
        auVar17._48_4_ = (uint)bVar2 * auVar16._48_4_ | (uint)!bVar2 * auVar20._48_4_;
        bVar2 = (bool)(bVar4 >> 5 & 1);
        auVar17._52_4_ = (uint)bVar2 * auVar16._52_4_ | (uint)!bVar2 * auVar20._52_4_;
        bVar2 = (bool)(bVar4 >> 6 & 1);
        auVar17._56_4_ = (uint)bVar2 * auVar16._56_4_ | (uint)!bVar2 * auVar20._56_4_;
        auVar17._60_4_ =
             (uint)(bVar4 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar4 >> 7) * auVar20._60_4_;
        auVar15 = vextracti64x4_avx512f(auVar17,1);
        auVar16 = vpaddd_avx512f(auVar17,ZEXT3264(auVar15));
        auVar24 = vpaddd_avx(auVar16._0_16_,auVar16._16_16_);
        auVar13 = vpshufd_avx(auVar24,0xee);
        auVar24 = vpaddd_avx(auVar24,auVar13);
        auVar13 = vpshufd_avx(auVar24,0x55);
        auVar24 = vpaddd_avx(auVar24,auVar13);
        iVar21 = auVar24._0_4_;
      }
      _Stack_1e0.reg_save_area = auStack_1c0;
      _Stack_1e0.overflow_arg_area = &local_100;
      _Stack_1e0.gp_offset = 0x18;
      _Stack_1e0.fp_offset = 0x30;
      puStack_1a8 = (undefined1 *)puVar8;
      uStack_1a0 = in_R8;
      uStack_198 = in_R9;
      pcStack_110 = (code *)fmt;
      verror_at(tokenizer,tokenizer->current_file->name,tokenizer->current_file->contents,iVar21,
                pcVar7,fmt_00,&_Stack_1e0);
      longjmp((__jmp_buf_tag *)tokenizer->env,1);
    }
    uVar11 = iVar5 + 1;
    bVar2 = false;
  } while (bVar10);
  return iVar5;
}

Assistant:

static int error_sprintf(C_Parser *parser, const char *fmt, ...) {
  va_list args;
  int pos = parser->error_message ? (int)strlen(parser->error_message) : 0;
  int estimated_size = 128;
  int n = 0;
  for (int i = 0; i < 2; i++) {
    parser->error_message = parser->memory_allocator->realloc(parser->memory_allocator->arena, parser->error_message, pos + estimated_size); // ensure we have at least estimated_size free space
    va_start(args, fmt);
    n = vsnprintf(parser->error_message + pos, estimated_size, fmt, args);
    va_end(args);
    if (n >= estimated_size) {
      estimated_size = n + 1; // allow for 0 byte
    } else if (n < 0) {
      fprintf(stderr, "Buffer conversion error\n");
      assert(false);
      break;
    } else {
      break;
    }
  }
  return n;
}